

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int mriStep_Predict(ARKodeMem ark_mem,int istage,N_Vector yguess)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ARKodeMem ark_mem_00;
  undefined8 *tau_00;
  ARKodeMem ark_mem_01;
  realtype tau_01;
  realtype in_RDX;
  int in_ESI;
  ARKodeMem in_RDI;
  bool bVar6;
  N_Vector *Xvecs;
  realtype *cvals;
  ARKodeMRIStepMem step_mem;
  realtype h;
  realtype tau;
  int nvec;
  int jstage;
  int retval;
  int i;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  realtype in_stack_ffffffffffffffa0;
  uint local_30;
  int nvec_00;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar7;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  if (in_RDI->step_mem == (void *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::MRIStep","mriStep_Predict",
                    "Time step module memory is NULL.");
    return -0x15;
  }
  ark_mem_00 = (ARKodeMem)in_RDI->step_mem;
  if ((in_RDI->interp == (ARKInterp)0x0) && (0 < *(int *)&ark_mem_00->step_getgammas)) {
    arkProcessError(in_RDI,-0x15,"ARKode::MRIStep","mriStep_Predict",
                    "Interpolation structure is NULL");
    return -0x15;
  }
  tau_00 = (undefined8 *)ark_mem_00->tcur;
  ark_mem_01 = (ARKodeMem)ark_mem_00->tretlast;
  if (in_RDI->initsetup != 0) {
    N_VScale(in_stack_ffffffffffffffa0,
             (N_Vector)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (N_Vector)0x1158d72);
    return 0;
  }
  tau_01 = (realtype)(ulong)(*(int *)&ark_mem_00->step_getgammas - 1);
  switch(tau_01) {
  case 0.0:
    local_4 = arkPredict_MaximumOrder
                        (ark_mem_01,tau_01,
                         (N_Vector)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    break;
  case 4.94065645841247e-324:
    local_4 = arkPredict_VariableOrder(ark_mem_00,(realtype)tau_00,(N_Vector)ark_mem_01);
    break;
  case 9.88131291682493e-324:
    local_4 = arkPredict_CutoffOrder(ark_mem_00,(realtype)tau_00,(N_Vector)ark_mem_01);
    break;
  case 1.48219693752374e-323:
    nvec_00 = -1;
    for (iVar7 = 0; iVar7 < in_ESI; iVar7 = iVar7 + 1) {
      dVar2 = *(double *)(*(long *)(*(long *)&ark_mem_00->atolmin0 + 0x10) + (long)iVar7 * 8);
      in_stack_ffffffffffffff9c = iVar7;
      if ((dVar2 == 0.0) && (!NAN(dVar2))) {
        in_stack_ffffffffffffff9c = nvec_00;
      }
      nvec_00 = in_stack_ffffffffffffff9c;
    }
    if (nvec_00 != -1) {
      for (iVar7 = 0; iVar7 < in_ESI; iVar7 = iVar7 + 1) {
        dVar2 = *(double *)(*(long *)(*(long *)&ark_mem_00->atolmin0 + 0x10) + (long)iVar7 * 8);
        pdVar1 = (double *)(*(long *)(*(long *)&ark_mem_00->atolmin0 + 0x10) + (long)nvec_00 * 8);
        if ((*pdVar1 <= dVar2 && dVar2 != *pdVar1) &&
           (((dVar2 = *(double *)
                       (*(long *)(*(long *)&ark_mem_00->atolmin0 + 0x10) + (long)iVar7 * 8),
             dVar2 != 0.0 || (NAN(dVar2))) &&
            (-1 < *(int *)(*(long *)&ark_mem_00->Ratolmin0 + (long)iVar7 * 4))))) {
          nvec_00 = iVar7;
        }
      }
      dVar2 = in_RDI->h;
      dVar3 = *(double *)(*(long *)(*(long *)&ark_mem_00->atolmin0 + 0x10) + (long)nvec_00 * 8);
      dVar4 = in_RDI->h;
      dVar5 = *(double *)(*(long *)(*(long *)&ark_mem_00->atolmin0 + 0x10) + (long)in_ESI * 8);
      bVar6 = ark_mem_00->ritol != 0;
      if (bVar6) {
        *tau_00 = 0x3ff0000000000000;
        ark_mem_01->sunctx =
             (SUNContext)
             (&ark_mem_00->Vabstol->content)
             [*(int *)(*(long *)&ark_mem_00->Ratolmin0 + (long)nvec_00 * 4)];
      }
      local_30 = (uint)bVar6;
      if (ark_mem_00->itol != 0) {
        tau_00[(int)local_30] = 0x3ff0000000000000;
        (&ark_mem_01->sunctx)[(int)local_30] =
             *(SUNContext *)
              ((long)ark_mem_00->Sabstol +
              (long)*(int *)(*(long *)&ark_mem_00->Ratolmin0 + (long)nvec_00 * 4) * 8);
      }
      local_4 = arkPredict_Bootstrap
                          ((ARKodeMem)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,
                           (realtype)CONCAT44(iVar7,in_stack_ffffffffffffffd8),nvec_00,
                           (realtype *)(dVar4 * dVar5),(N_Vector *)(dVar2 * dVar3),
                           (N_Vector)ark_mem_00);
      break;
    }
  default:
    goto switchD_01158de9_default;
  }
  if (local_4 == -0x16) {
switchD_01158de9_default:
    N_VScale(tau_01,(N_Vector)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (N_Vector)0x11590f8);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mriStep_Predict(ARKodeMem ark_mem, int istage, N_Vector yguess)
{
  int i, retval, jstage, nvec;
  realtype tau;
  realtype h;
  ARKodeMRIStepMem step_mem;
  realtype* cvals;
  N_Vector* Xvecs;

  /* access ARKodeMRIStepMem structure */
  if (ark_mem->step_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::MRIStep",
                    "mriStep_Predict", MSG_MRISTEP_NO_MEM);
    return(ARK_MEM_NULL);
  }
  step_mem = (ARKodeMRIStepMem) ark_mem->step_mem;

  /* verify that interpolation structure is provided */
  if ((ark_mem->interp == NULL) && (step_mem->predictor > 0)) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::MRIStep",
                    "mriStep_Predict",
                    "Interpolation structure is NULL");
    return(ARK_MEM_NULL);
  }

  /* local shortcuts for use with fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* if the first step (or if resized), use initial condition as guess */
  if (ark_mem->initsetup) {
    N_VScale(ONE, ark_mem->yn, yguess);
    return(ARK_SUCCESS);
  }

  /* set evaluation time tau as relative shift from previous successful time */
  tau = step_mem->MRIC->c[istage]*ark_mem->h/ark_mem->hold;

  /* use requested predictor formula */
  switch (step_mem->predictor) {

  case 1:

    /***** Interpolatory Predictor 1 -- all to max order *****/
    retval = arkPredict_MaximumOrder(ark_mem, tau, yguess);
    if (retval != ARK_ILL_INPUT)  return(retval);
    break;

  case 2:

    /***** Interpolatory Predictor 2 -- decrease order w/ increasing level of extrapolation *****/
    retval = arkPredict_VariableOrder(ark_mem, tau, yguess);
    if (retval != ARK_ILL_INPUT)  return(retval);
    break;

  case 3:

    /***** Cutoff predictor: max order interpolatory output for stages "close"
           to previous step, first-order predictor for subsequent stages *****/
    retval = arkPredict_CutoffOrder(ark_mem, tau, yguess);
    if (retval != ARK_ILL_INPUT)  return(retval);
    break;

  case 4:

    /***** Bootstrap predictor: if any previous stage in step has nonzero c_i,
           construct a quadratic Hermite interpolant for prediction; otherwise
           use the trivial predictor.  The actual calculations are performed in
           arkPredict_Bootstrap, but here we need to determine the appropriate
           stage, c_j, to use. *****/

    /* determine if any previous stages in step meet criteria */
    jstage = -1;
    for (i=0; i<istage; i++)
      jstage = (step_mem->MRIC->c[i] != ZERO) ? i : jstage;

    /* if using the trivial predictor, break */
    if (jstage == -1)  break;

    /* find the "optimal" previous stage to use */
    for (i=0; i<istage; i++)
      if ( (step_mem->MRIC->c[i] > step_mem->MRIC->c[jstage]) &&
           (step_mem->MRIC->c[i] != ZERO) && step_mem->stage_map[i] > -1)
        jstage = i;

    /* set stage time, stage RHS and interpolation values */
    h = ark_mem->h * step_mem->MRIC->c[jstage];
    tau = ark_mem->h * step_mem->MRIC->c[istage];
    nvec = 0;
    if (step_mem->implicit_rhs) {    /* Implicit piece */
      cvals[nvec] = ONE;
      Xvecs[nvec] = step_mem->Fsi[step_mem->stage_map[jstage]];
      nvec += 1;
    }
    if (step_mem->explicit_rhs) {    /* Explicit piece */
      cvals[nvec] = ONE;
      Xvecs[nvec] = step_mem->Fse[step_mem->stage_map[jstage]];
      nvec += 1;
    }

    /* call predictor routine */
    retval = arkPredict_Bootstrap(ark_mem, h, tau, nvec, cvals, Xvecs, yguess);
    if (retval != ARK_ILL_INPUT)  return(retval);
    break;

  }

  /* if we made it here, use the trivial predictor (previous step solution) */
  N_VScale(ONE, ark_mem->yn, yguess);
  return(ARK_SUCCESS);
}